

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O2

void __thiscall Graph<Node>::printConnectedComponents(Graph<Node> *this,ofstream *fout)

{
  vector<int> *pvVar1;
  ostream *poVar2;
  long lVar3;
  long lVar4;
  
  std::operator<<((ostream *)fout,"Connected components in current graph:\n\n");
  for (lVar3 = 0; lVar3 < (this->compList)._size; lVar3 = lVar3 + 1) {
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)fout,(int)lVar3);
    std::operator<<(poVar2,": ");
    for (lVar4 = 0; pvVar1 = (this->compList).vect, lVar4 < pvVar1[lVar3]._size; lVar4 = lVar4 + 1)
    {
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)fout,pvVar1[lVar3].vect[lVar4]);
      std::operator<<(poVar2,' ');
    }
    std::operator<<((ostream *)fout,'\n');
  }
  std::operator<<((ostream *)fout,"------------------------\n\n");
  return;
}

Assistant:

void printConnectedComponents(std::ofstream &fout) {
        fout << "Connected components in current graph:\n\n";
        for (int i = 0; i < compList.size(); ++i) {
            fout << i << ": ";
            for (int j = 0; j < compList[i].size(); ++j) {
                fout << compList[i][j] << ' ';
            }
            fout << '\n';
        }

        fout << "------------------------\n\n";
    }